

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stock.cpp
# Opt level: O0

void use_stock(void)

{
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  Stock merlin;
  
  L10_1::Stock::Stock((Stock *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"Apple",&local_61);
  L10_1::Stock::acquire((Stock *)local_40,&local_60,0x14,30.0);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  L10_1::Stock::show((Stock *)local_40);
  L10_1::Stock::buy((Stock *)local_40,0x1e,50.0);
  L10_1::Stock::show((Stock *)local_40);
  L10_1::Stock::sell((Stock *)local_40,1000,12.45);
  L10_1::Stock::show((Stock *)local_40);
  L10_1::Stock::buy((Stock *)local_40,30000,58.3);
  L10_1::Stock::show((Stock *)local_40);
  L10_1::Stock::sell((Stock *)local_40,30000,0.125);
  L10_1::Stock::show((Stock *)local_40);
  L10_1::Stock::~Stock((Stock *)local_40);
  return;
}

Assistant:

void use_stock() {
    using namespace L10_1;
    //  通过实例化的对象来调用
    Stock merlin;
    merlin.acquire("Apple", 20, 30);
    merlin.show();
    merlin.buy(30, 50);
    merlin.show();
    merlin.sell(1000, 12.45);
    merlin.show();
    merlin.buy(30000, 58.3);
    merlin.show();
    merlin.sell(30000, 0.125);
    merlin.show();

    //  不能直接通过限定名
//    Stock::show();
}